

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O2

pair<llvm::ReplacementItem,_llvm::StringRef> *
llvm::formatv_object_base::splitLiteralAndReplacement
          (pair<llvm::ReplacementItem,_llvm::StringRef> *__return_storage_ptr__,StringRef Fmt)

{
  bool *this;
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  undefined4 uVar5;
  AlignStyle AVar6;
  char cVar7;
  undefined3 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ReplacementItem *pRVar13;
  size_t in_RCX;
  ulong uVar14;
  size_t sVar15;
  StringRef SVar16;
  function_ref<bool_(char)> F;
  undefined1 auStack_98 [8];
  Optional<llvm::ReplacementItem> RI;
  StringRef Fmt_local;
  undefined1 local_31;
  
  uVar14 = Fmt.Length;
  RI.Storage._64_8_ = Fmt.Data;
  this = &RI.Storage.hasVal;
  uVar10 = 0;
  while( true ) {
    if (uVar14 <= uVar10) {
      (__return_storage_ptr__->first).Index = 0;
      (__return_storage_ptr__->first).Align = 0;
      (__return_storage_ptr__->second).Data = (char *)0x0;
      (__return_storage_ptr__->second).Length = 0;
      (__return_storage_ptr__->first).Type = Literal;
      (__return_storage_ptr__->first).Spec.Data = (char *)RI.Storage._64_8_;
      (__return_storage_ptr__->first).Spec.Length = uVar14;
      (__return_storage_ptr__->first).Where = Right;
      (__return_storage_ptr__->first).Pad = '\0';
      *(ulong *)&(__return_storage_ptr__->first).field_0x2d = (ulong)(uint3)auStack_98._0_3_;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).Options.Data + 5) = 0;
      *(undefined4 *)((long)&(__return_storage_ptr__->first).Options.Length + 4) = 0;
      return __return_storage_ptr__;
    }
    uVar10 = StringRef::find((StringRef *)this,'{',uVar10);
    if (uVar10 != 0) break;
    SVar16 = StringRef::drop_front((StringRef *)this,0);
    auStack_98._0_3_ = SVar16.Data._0_3_;
    auStack_98._3_5_ = SVar16.Data._3_5_;
    RI.Storage.field_0.value.Type._0_3_ = SVar16.Length._0_3_;
    RI.Storage.field_0._3_4_ = SVar16.Length._3_4_;
    RI.Storage.field_0._7_1_ = SVar16.Length._7_1_;
    F.callable = (intptr_t)&local_31;
    F.callback = function_ref<bool(char)>::
                 callback_fn<llvm::formatv_object_base::splitLiteralAndReplacement(llvm::StringRef)::__0>
    ;
    SVar16 = StringRef::take_while((StringRef *)auStack_98,F);
    uVar9 = RI.Storage._64_8_;
    uVar10 = SVar16.Length;
    if (1 < uVar10) {
      uVar12 = uVar10 >> 1;
      if (uVar14 < uVar10 >> 1) {
        uVar12 = uVar14;
      }
      SVar16 = StringRef::drop_front((StringRef *)&RI.Storage.hasVal,uVar10 & 0xfffffffffffffffe);
      sVar11 = SVar16.Length;
      (__return_storage_ptr__->first).Index = 0;
      (__return_storage_ptr__->first).Align = 0;
      (__return_storage_ptr__->first).Type = Literal;
      (__return_storage_ptr__->first).Spec.Data = (char *)uVar9;
      (__return_storage_ptr__->first).Spec.Length = uVar12;
      (__return_storage_ptr__->first).Where = Right;
      (__return_storage_ptr__->first).Pad = '\0';
      *(ulong *)&(__return_storage_ptr__->first).field_0x2d = (ulong)(uint3)auStack_98._0_3_;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).Options.Data + 5) = 0;
      *(undefined4 *)((long)&(__return_storage_ptr__->first).Options.Length + 4) = 0;
      (__return_storage_ptr__->second).Data = SVar16.Data;
      goto LAB_00dba36c;
    }
    sVar11 = StringRef::find((StringRef *)this,'}',0);
    if (sVar11 == 0xffffffffffffffff) {
      __assert_fail("false && \"Unterminated brace sequence.  Escape with {{ for a literal brace.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                    ,0x75,
                    "static std::pair<ReplacementItem, StringRef> llvm::formatv_object_base::splitLiteralAndReplacement(StringRef)"
                   );
    }
    uVar10 = StringRef::find((StringRef *)this,'{',1);
    uVar9 = RI.Storage._64_8_;
    if (uVar10 < sVar11) break;
    uVar12 = (ulong)(uVar14 != 0);
    sVar15 = sVar11;
    if (sVar11 < uVar12) {
      sVar15 = uVar12;
    }
    if (uVar14 < sVar11) {
      sVar15 = uVar14;
    }
    SVar16.Data = (char *)(sVar15 - uVar12);
    uVar10 = sVar11 + 1;
    SVar16.Length = in_RCX;
    parseReplacementItem
              ((Optional<llvm::ReplacementItem> *)auStack_98,
               (formatv_object_base *)(uVar12 + RI.Storage._64_8_),SVar16);
    if (RI.Storage.field_0.value.Options.Length._0_1_ == '\x01') {
      if (uVar14 < uVar10) {
        uVar10 = uVar14;
      }
      pRVar13 = optional_detail::OptionalStorage<llvm::ReplacementItem,_true>::getValue
                          ((OptionalStorage<llvm::ReplacementItem,_true> *)auStack_98);
      uVar5 = *(undefined4 *)&pRVar13->field_0x4;
      pcVar1 = (pRVar13->Spec).Data;
      sVar11 = (pRVar13->Spec).Length;
      sVar15 = pRVar13->Index;
      sVar2 = pRVar13->Align;
      AVar6 = pRVar13->Where;
      cVar7 = pRVar13->Pad;
      uVar8 = *(undefined3 *)&pRVar13->field_0x2d;
      pcVar3 = (pRVar13->Options).Data;
      sVar4 = (pRVar13->Options).Length;
      (__return_storage_ptr__->first).Type = pRVar13->Type;
      *(undefined4 *)&(__return_storage_ptr__->first).field_0x4 = uVar5;
      (__return_storage_ptr__->first).Spec.Data = pcVar1;
      (__return_storage_ptr__->first).Spec.Length = sVar11;
      (__return_storage_ptr__->first).Index = sVar15;
      (__return_storage_ptr__->first).Align = sVar2;
      (__return_storage_ptr__->first).Where = AVar6;
      (__return_storage_ptr__->first).Pad = cVar7;
      *(undefined3 *)&(__return_storage_ptr__->first).field_0x2d = uVar8;
      (__return_storage_ptr__->first).Options.Data = pcVar3;
      (__return_storage_ptr__->first).Options.Length = sVar4;
      (__return_storage_ptr__->second).Data = (char *)(uVar9 + uVar10);
      (__return_storage_ptr__->second).Length = uVar14 - uVar10;
      return __return_storage_ptr__;
    }
  }
  if (uVar14 < uVar10) {
    uVar10 = uVar14;
  }
  (__return_storage_ptr__->first).Index = 0;
  (__return_storage_ptr__->first).Align = 0;
  sVar11 = uVar14 - uVar10;
  (__return_storage_ptr__->first).Type = Literal;
  (__return_storage_ptr__->first).Spec.Data = (char *)RI.Storage._64_8_;
  (__return_storage_ptr__->first).Spec.Length = uVar10;
  (__return_storage_ptr__->first).Where = Right;
  (__return_storage_ptr__->first).Pad = '\0';
  *(ulong *)&(__return_storage_ptr__->first).field_0x2d = (ulong)(uint3)auStack_98._0_3_;
  *(undefined8 *)((long)&(__return_storage_ptr__->first).Options.Data + 5) = 0;
  *(undefined4 *)((long)&(__return_storage_ptr__->first).Options.Length + 4) = 0;
  (__return_storage_ptr__->second).Data = (char *)(RI.Storage._64_8_ + uVar10);
LAB_00dba36c:
  (__return_storage_ptr__->second).Length = sVar11;
  return __return_storage_ptr__;
}

Assistant:

std::pair<ReplacementItem, StringRef>
formatv_object_base::splitLiteralAndReplacement(StringRef Fmt) {
  std::size_t From = 0;
  while (From < Fmt.size() && From != StringRef::npos) {
    std::size_t BO = Fmt.find_first_of('{', From);
    // Everything up until the first brace is a literal.
    if (BO != 0)
      return std::make_pair(ReplacementItem{Fmt.substr(0, BO)}, Fmt.substr(BO));

    StringRef Braces =
        Fmt.drop_front(BO).take_while([](char C) { return C == '{'; });
    // If there is more than one brace, then some of them are escaped.  Treat
    // these as replacements.
    if (Braces.size() > 1) {
      size_t NumEscapedBraces = Braces.size() / 2;
      StringRef Middle = Fmt.substr(BO, NumEscapedBraces);
      StringRef Right = Fmt.drop_front(BO + NumEscapedBraces * 2);
      return std::make_pair(ReplacementItem{Middle}, Right);
    }
    // An unterminated open brace is undefined.  We treat the rest of the string
    // as a literal replacement, but we assert to indicate that this is
    // undefined and that we consider it an error.
    std::size_t BC = Fmt.find_first_of('}', BO);
    if (BC == StringRef::npos) {
      assert(
          false &&
          "Unterminated brace sequence.  Escape with {{ for a literal brace.");
      return std::make_pair(ReplacementItem{Fmt}, StringRef());
    }

    // Even if there is a closing brace, if there is another open brace before
    // this closing brace, treat this portion as literal, and try again with the
    // next one.
    std::size_t BO2 = Fmt.find_first_of('{', BO + 1);
    if (BO2 < BC)
      return std::make_pair(ReplacementItem{Fmt.substr(0, BO2)},
                            Fmt.substr(BO2));

    StringRef Spec = Fmt.slice(BO + 1, BC);
    StringRef Right = Fmt.substr(BC + 1);

    auto RI = parseReplacementItem(Spec);
    if (RI.hasValue())
      return std::make_pair(*RI, Right);

    // If there was an error parsing the replacement item, treat it as an
    // invalid replacement spec, and just continue.
    From = BC + 1;
  }
  return std::make_pair(ReplacementItem{Fmt}, StringRef());
}